

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsVulkanUniformBuffer(Instruction *this)

{
  Op OVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  DefUseManager *pDVar4;
  DecorationManager *this_00;
  anon_class_8_1_ee6852b6 local_58;
  function<void_(const_spvtools::opt::Instruction_&)> local_50;
  bool local_29;
  Instruction *pIStack_28;
  bool is_block;
  Instruction *base_type;
  Instruction *pIStack_18;
  StorageClass storage_class;
  Instruction *this_local;
  
  pIStack_18 = this;
  OVar1 = opcode(this);
  if (OVar1 != OpTypePointer) {
    return false;
  }
  base_type._4_4_ = GetSingleWordInOperand(this,0);
  if (base_type._4_4_ == 2) {
    pIVar3 = context(this);
    pDVar4 = IRContext::get_def_use_mgr(pIVar3);
    uVar2 = GetSingleWordInOperand(this,1);
    pIStack_28 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
    OVar1 = opcode(pIStack_28);
    if ((OVar1 == OpTypeArray) || (OVar1 = opcode(pIStack_28), OVar1 == OpTypeRuntimeArray)) {
      pIVar3 = context(this);
      pDVar4 = IRContext::get_def_use_mgr(pIVar3);
      uVar2 = GetSingleWordInOperand(pIStack_28,0);
      pIStack_28 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
    }
    OVar1 = opcode(pIStack_28);
    if (OVar1 == OpTypeStruct) {
      local_29 = false;
      pIVar3 = context(this);
      this_00 = IRContext::get_decoration_mgr(pIVar3);
      uVar2 = result_id(pIStack_28);
      local_58.is_block = &local_29;
      std::function<void(spvtools::opt::Instruction_const&)>::
      function<spvtools::opt::Instruction::IsVulkanUniformBuffer()const::__0,void>
                ((function<void(spvtools::opt::Instruction_const&)> *)&local_50,&local_58);
      analysis::DecorationManager::ForEachDecoration(this_00,uVar2,2,&local_50);
      std::function<void_(const_spvtools::opt::Instruction_&)>::~function(&local_50);
      this_local._7_1_ = (bool)(local_29 & 1);
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanUniformBuffer() const {
  if (opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kPointerTypeStorageClassIndex));
  if (storage_class != spv::StorageClass::Uniform) {
    return false;
  }

  Instruction* base_type =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(1));

  // Unpack the optional layer of arraying.
  if (base_type->opcode() == spv::Op::OpTypeArray ||
      base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
    base_type = context()->get_def_use_mgr()->GetDef(
        base_type->GetSingleWordInOperand(0));
  }

  if (base_type->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  bool is_block = false;
  context()->get_decoration_mgr()->ForEachDecoration(
      base_type->result_id(), uint32_t(spv::Decoration::Block),
      [&is_block](const Instruction&) { is_block = true; });
  return is_block;
}